

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.h
# Opt level: O2

void __thiscall cmQtAutoGenInitializer::MocT::MocT(MocT *this)

{
  _Rb_tree_header *p_Var1;
  
  GenVarsT::GenVarsT(&this->super_GenVarsT,MOC,&cmQtAutoGen::GenAutoMoc_abi_cxx11_,
                     &cmQtAutoGen::GenAUTOMOC_abi_cxx11_);
  (this->PredefsCmd)._M_dataplus._M_p = (pointer)&(this->PredefsCmd).field_2;
  (this->PredefsCmd)._M_string_length = 0;
  (this->PredefsCmd).field_2._M_local_buf[0] = '\0';
  (this->Includes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Includes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Includes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->ConfigIncludes)._M_t._M_impl.super__Rb_tree_header;
  (this->ConfigIncludes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ConfigIncludes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ConfigIncludes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ConfigIncludes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ConfigIncludes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->Defines)._M_t._M_impl.super__Rb_tree_header;
  (this->Defines)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Defines)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Defines)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Defines)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Defines)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ConfigDefines)._M_t._M_impl.super__Rb_tree_header;
  (this->ConfigDefines)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ConfigDefines)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ConfigDefines)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ConfigDefines)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ConfigDefines)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->MocsCompilation)._M_dataplus._M_p = (pointer)&(this->MocsCompilation).field_2;
  (this->MocsCompilation)._M_string_length = 0;
  (this->MocsCompilation).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

MocT()
      : GenVarsT(cmQtAutoGen::GenT::MOC, cmQtAutoGen::GenAutoMoc,
                 cmQtAutoGen::GenAUTOMOC){}